

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void cleanup_blendings(REGIONS *regions,int *num_regions)

{
  int *in_RSI;
  long in_RDI;
  double next_diff;
  double prev_diff;
  int merge;
  int total_neighbors;
  int has_blend_neighbor;
  int has_stable_neighbor;
  int is_short_hv;
  int is_short_blending;
  int k;
  int *in_stack_ffffffffffffffa8;
  REGIONS *in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffb9;
  bool bVar1;
  undefined1 in_stack_ffffffffffffffbb;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    bVar5 = false;
    if (local_14 < *in_RSI) {
      bVar5 = 1 < *in_RSI;
    }
    if (bVar5 == false) break;
    bVar4 = false;
    if (*(int *)(in_RDI + (long)local_14 * 0x38 + 0x30) == 3) {
      bVar4 = (*(int *)(in_RDI + (long)local_14 * 0x38 + 4) -
              *(int *)(in_RDI + (long)local_14 * 0x38)) + 1 < 5;
    }
    bVar3 = false;
    if (*(int *)(in_RDI + (long)local_14 * 0x38 + 0x30) == 1) {
      bVar3 = (*(int *)(in_RDI + (long)local_14 * 0x38 + 4) -
              *(int *)(in_RDI + (long)local_14 * 0x38)) + 1 < 5;
    }
    if (((local_14 < 1) ||
        (bVar2 = true, *(int *)(in_RDI + (long)(local_14 + -1) * 0x38 + 0x30) != 0)) &&
       (in_stack_ffffffffffffffbb = false, bVar2 = (bool)in_stack_ffffffffffffffbb,
       local_14 < *in_RSI + -1)) {
      in_stack_ffffffffffffffbb = *(int *)(in_RDI + (long)(local_14 + 1) * 0x38 + 0x30) == 0;
      bVar2 = (bool)in_stack_ffffffffffffffbb;
    }
    if (((local_14 < 1) ||
        (bVar1 = true, *(int *)(in_RDI + (long)(local_14 + -1) * 0x38 + 0x30) != 3)) &&
       (in_stack_ffffffffffffffb9 = false, bVar1 = (bool)in_stack_ffffffffffffffb9,
       local_14 < *in_RSI + -1)) {
      in_stack_ffffffffffffffb9 = *(int *)(in_RDI + (long)(local_14 + 1) * 0x38 + 0x30) == 3;
      bVar1 = (bool)in_stack_ffffffffffffffb9;
    }
    if ((bVar4 == false) &&
       ((bVar3 == false ||
        ((byte)(bVar2 + bVar1) < (byte)((0 < local_14) + (local_14 < *in_RSI + -1)))))) {
      local_14 = local_14 + 1;
    }
    else {
      if (local_14 < 1) {
        in_stack_ffffffffffffffb0 = (REGIONS *)0x3ff0000000000000;
      }
      else {
        in_stack_ffffffffffffffb0 =
             (REGIONS *)
             ABS(*(double *)(in_RDI + (long)local_14 * 0x38 + 0x10) -
                 *(double *)(in_RDI + (long)(local_14 + -1) * 0x38 + 0x10));
      }
      if (local_14 < *in_RSI + -1) {
        in_stack_ffffffffffffffa8 =
             (int *)ABS(*(double *)(in_RDI + (long)local_14 * 0x38 + 0x10) -
                        *(double *)(in_RDI + (long)(local_14 + 1) * 0x38 + 0x10));
      }
      else {
        in_stack_ffffffffffffffa8 = (int *)0x3ff0000000000000;
      }
      remove_region((uint)((double)in_stack_ffffffffffffffa8 < (double)in_stack_ffffffffffffffb0),
                    in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                    (int *)CONCAT17(bVar5,CONCAT16(bVar4,CONCAT15(bVar3,CONCAT14(bVar2,CONCAT13(
                                                  in_stack_ffffffffffffffbb,
                                                  CONCAT12(bVar1,CONCAT11(in_stack_ffffffffffffffb9,
                                                                          in_stack_ffffffffffffffb8)
                                                          )))))));
    }
  }
  cleanup_regions(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

static void cleanup_blendings(REGIONS *regions, int *num_regions) {
  int k = 0;
  while (k<*num_regions && * num_regions> 1) {
    int is_short_blending = regions[k].type == BLENDING_REGION &&
                            regions[k].last - regions[k].start + 1 < 5;
    int is_short_hv = regions[k].type == HIGH_VAR_REGION &&
                      regions[k].last - regions[k].start + 1 < 5;
    int has_stable_neighbor =
        ((k > 0 && regions[k - 1].type == STABLE_REGION) ||
         (k < *num_regions - 1 && regions[k + 1].type == STABLE_REGION));
    int has_blend_neighbor =
        ((k > 0 && regions[k - 1].type == BLENDING_REGION) ||
         (k < *num_regions - 1 && regions[k + 1].type == BLENDING_REGION));
    int total_neighbors = (k > 0) + (k < *num_regions - 1);

    if (is_short_blending ||
        (is_short_hv &&
         has_stable_neighbor + has_blend_neighbor >= total_neighbors)) {
      // Remove this region.Try to determine whether to combine it with the
      // previous or next region.
      int merge;
      double prev_diff =
          (k > 0)
              ? fabs(regions[k].avg_cor_coeff - regions[k - 1].avg_cor_coeff)
              : 1;
      double next_diff =
          (k < *num_regions - 1)
              ? fabs(regions[k].avg_cor_coeff - regions[k + 1].avg_cor_coeff)
              : 1;
      // merge == 0 means to merge with previous, 1 means to merge with next
      merge = prev_diff > next_diff;
      remove_region(merge, regions, num_regions, &k);
    } else {
      k++;
    }
  }
  cleanup_regions(regions, num_regions);
}